

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int evfilt_timer_knote_modify(filter *filt,knote *kn,kevent *kev)

{
  uint flags;
  int iVar1;
  int iVar2;
  itimerspec ts;
  
  flags = kev->fflags;
  convert_timedata_to_itimerspec(&ts,kev->data,flags,kev->flags & 0x10);
  iVar2 = 0;
  iVar1 = timerfd_settime((kn->field_10).kn_timerfd,flags >> 3 & 1,(itimerspec *)&ts,
                          (itimerspec *)0x0);
  if (iVar1 < 0) {
    iVar2 = -1;
  }
  else {
    (kn->kev).flags = kev->flags | 0x20;
    (kn->kev).fflags = kev->fflags;
    (kn->kev).data = kev->data;
  }
  return iVar2;
}

Assistant:

int
evfilt_timer_knote_modify(struct filter *filt, struct knote *kn,
        const struct kevent *kev)
{
    struct itimerspec ts;
    int flags;

    dbg_printf("timer_fd=%i - modified", kn->kn_timerfd);

    convert_timedata_to_itimerspec(&ts, kev->data, kev->fflags,
                                   kev->flags & EV_ONESHOT);
    flags = (kev->fflags & NOTE_ABSOLUTE) ? TFD_TIMER_ABSTIME : 0;
    if (timerfd_settime(kn->kn_timerfd, flags, &ts, NULL) < 0) {
        dbg_printf("timerfd_settime(2): %s", strerror(errno));
        return (-1);
    }

    kn->kev.flags = kev->flags | EV_CLEAR;
    kn->kev.fflags = kev->fflags;
    kn->kev.data = kev->data;

    return (0);
}